

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O0

void __thiscall
SMBusPacket::CreateDefaultFrames
          (SMBusPacket *this,SMBusAnalyzerResults *pResults,SMBusProtocol *pProt,bool has_pec,
          SMBusDecodeLevel dec_level)

{
  SMBusProtocol *pSVar1;
  SMBusProtocol *pSVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  SMBusByte local_230;
  int local_204;
  undefined1 local_200 [4];
  int bytes_remaining;
  int local_1d4;
  undefined1 local_1d0 [4];
  int c;
  SMBusByte local_1a8;
  SMBusByte local_180;
  SMBusByte local_158;
  SMBusByte local_130;
  SMBusByte local_108;
  SMBusByte local_e0;
  SMBusByte local_b8;
  SMBusByte local_80;
  const_reference local_58;
  vector<SMBusByte,_std::allocator<SMBusByte>_> *chunk;
  int byte_count;
  bool should_end_on_nack;
  size_t chnkcnt;
  size_t bcnt;
  SMBP_ProtElem *pSStack_30;
  U8 prot_elem_ndx;
  SMBP_ProtElem *pProtElems;
  SMBusDecodeLevel dec_level_local;
  bool has_pec_local;
  SMBusProtocol *pProt_local;
  SMBusAnalyzerResults *pResults_local;
  SMBusPacket *this_local;
  
  pSStack_30 = pProt->prot_elems;
  chnkcnt = 0;
  _byte_count = 0;
  chunk._7_1_ = 0;
  chunk._0_4_ = 0xffffffff;
  pProtElems._0_4_ = dec_level;
  pProtElems._7_1_ = has_pec;
  _dec_level_local = pProt;
  pProt_local = (SMBusProtocol *)pResults;
  pResults_local = (SMBusAnalyzerResults *)this;
  for (bcnt._7_1_ = 1; pSStack_30[bcnt._7_1_] != SMBP_Stop; bcnt._7_1_ = bcnt._7_1_ + 1) {
    local_58 = std::
               vector<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
               ::operator[](&this->chunks,_byte_count);
    pSVar1 = pProt_local;
    switch(pSStack_30[bcnt._7_1_]) {
    case SMBP_Start:
      chnkcnt = 0;
      _byte_count = _byte_count + 1;
      break;
    case SMBP_AddrAny:
    case SMBP_AddrWrite:
    case SMBP_AddrHostWrite:
      pSVar2 = (SMBusProtocol *)
               std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
      SMBusByte::ToAddrFrame(&local_80,pSVar2);
      AnalyzerResults::AddFrame((Frame *)pSVar1);
      Frame::~Frame((Frame *)&local_80);
      chnkcnt = chnkcnt + 1;
      chunk._7_1_ = 0;
      break;
    case SMBP_AddrRead:
      pSVar2 = (SMBusProtocol *)
               std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
      SMBusByte::ToAddrFrame(&local_b8,pSVar2);
      AnalyzerResults::AddFrame((Frame *)pSVar1);
      Frame::~Frame((Frame *)&local_b8);
      chnkcnt = chnkcnt + 1;
      chunk._7_1_ = 1;
      break;
    case SMBP_Command:
      if ((SMBusDecodeLevel)pProtElems == DL_PMBus) {
        std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
        SMBusByte::ToPMBusCommandFrame(&local_e0);
        AnalyzerResults::AddFrame((Frame *)pSVar1);
        Frame::~Frame((Frame *)&local_e0);
      }
      else if ((SMBusDecodeLevel)pProtElems == DL_SmartBattery) {
        std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
        SMBusByte::ToSmartBatteryCommandFrame(&local_108);
        AnalyzerResults::AddFrame((Frame *)pSVar1);
        Frame::~Frame((Frame *)&local_108);
      }
      else {
        std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
        SMBusByte::ToSMBusCommandFrame(&local_130);
        AnalyzerResults::AddFrame((Frame *)pSVar1);
        Frame::~Frame((Frame *)&local_130);
      }
      chnkcnt = chnkcnt + 1;
      break;
    case SMBP_CommandExt:
      pvVar6 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
      std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt + 1);
      SMBusByte::ToPMBusCommandExtFrame(&local_158,pvVar6);
      AnalyzerResults::AddFrame((Frame *)pSVar1);
      Frame::~Frame((Frame *)&local_158);
      chnkcnt = chnkcnt + 2;
      break;
    case SMBP_DataByte:
      pvVar6 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
      SMBusByte::ToDataByte(&local_180,(SMBusFrameType)pvVar6);
      AnalyzerResults::AddFrame((Frame *)pSVar1);
      Frame::~Frame((Frame *)&local_180);
      chnkcnt = chnkcnt + 1;
      break;
    case SMBP_DataWord:
      pvVar6 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
      pvVar3 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt + 1);
      SMBusByte::ToDataWord(&local_1a8,pvVar6,(SMBusFrameType)pvVar3);
      AnalyzerResults::AddFrame((Frame *)pSVar1);
      Frame::~Frame((Frame *)&local_1a8);
      chnkcnt = chnkcnt + 2;
      break;
    case SMBP_ByteCount:
      std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
      SMBusByte::ToByteCount((SMBusByte *)local_1d0);
      AnalyzerResults::AddFrame((Frame *)pSVar1);
      Frame::~Frame((Frame *)local_1d0);
      pvVar6 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[](local_58,chnkcnt);
      chunk._0_4_ = (uint)pvVar6->value;
      chnkcnt = chnkcnt + 1;
      break;
    case SMBP_DataBlock:
      for (local_1d4 = 0; pSVar1 = pProt_local, local_1d4 < (int)(uint)chunk;
          local_1d4 = local_1d4 + 1) {
        pvVar6 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::operator[]
                           (local_58,chnkcnt + (long)local_1d4);
        SMBusByte::ToDataByte((SMBusByte *)local_200,(SMBusFrameType)pvVar6);
        AnalyzerResults::AddFrame((Frame *)pSVar1);
        Frame::~Frame((Frame *)local_200);
      }
      chnkcnt = (long)(int)(uint)chunk + chnkcnt;
      chunk._0_4_ = 0xffffffff;
    }
  }
  pvVar4 = std::
           vector<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
           ::back(&this->chunks);
  sVar5 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::size(pvVar4);
  pSVar1 = pProt_local;
  local_204 = (int)sVar5 - (int)chnkcnt;
  if (((pProtElems._7_1_ & 1) != 0) && (local_204 == 1)) {
    pvVar4 = std::
             vector<std::vector<SMBusByte,_std::allocator<SMBusByte>_>,_std::allocator<std::vector<SMBusByte,_std::allocator<SMBusByte>_>_>_>
             ::back(&this->chunks);
    pvVar6 = std::vector<SMBusByte,_std::allocator<SMBusByte>_>::back(pvVar4);
    CalcPEC(this,(bool)(pProtElems._7_1_ & 1));
    SMBusByte::ToPECFrame(&local_230,(U8)pvVar6);
    AnalyzerResults::AddFrame((Frame *)pSVar1);
    Frame::~Frame((Frame *)&local_230);
  }
  return;
}

Assistant:

void SMBusPacket::CreateDefaultFrames( SMBusAnalyzerResults* pResults, const SMBusProtocol* pProt, bool has_pec,
                                       SMBusDecodeLevel dec_level ) const
{
    const SMBP_ProtElem* pProtElems = pProt->prot_elems;

    U8 prot_elem_ndx = 1; // skip the initial Start

    size_t bcnt = 0, chnkcnt = 0;
    bool should_end_on_nack = false;
    int byte_count = -1;
    while( pProtElems[ prot_elem_ndx ] != SMBP_Stop )
    {
        const std::vector<SMBusByte>& chunk( chunks[ chnkcnt ] );

        switch( pProtElems[ prot_elem_ndx ] )
        {
        case SMBP_Start:
            bcnt = 0;
            ++chnkcnt;
            break;
        case SMBP_AddrAny:
        case SMBP_AddrWrite:
        case SMBP_AddrHostWrite:
            pResults->AddFrame( chunk[ bcnt ].ToAddrFrame( pProt ) );
            ++bcnt;
            should_end_on_nack = false;
            break;
        case SMBP_AddrRead:
            pResults->AddFrame( chunk[ bcnt ].ToAddrFrame( pProt ) );
            ++bcnt;
            should_end_on_nack = true;
            break;
        case SMBP_Command:
            if( dec_level == DL_PMBus )
                pResults->AddFrame( chunk[ bcnt ].ToPMBusCommandFrame() );
            else if( dec_level == DL_SmartBattery )
                pResults->AddFrame( chunk[ bcnt ].ToSmartBatteryCommandFrame() );
            else
                pResults->AddFrame( chunk[ bcnt ].ToSMBusCommandFrame() );

            ++bcnt;
            break;
        case SMBP_CommandExt:
            pResults->AddFrame( chunk[ bcnt ].ToPMBusCommandExtFrame( chunk[ bcnt + 1 ] ) );
            bcnt += 2;
            break;
        case SMBP_DataByte:
            pResults->AddFrame( chunk[ bcnt ].ToDataByte() );
            ++bcnt;
            break;
        case SMBP_DataWord:
            pResults->AddFrame( chunk[ bcnt ].ToDataWord( chunk[ bcnt + 1 ] ) );
            bcnt += 2;
            break;
        case SMBP_ByteCount:
            pResults->AddFrame( chunk[ bcnt ].ToByteCount() );
            byte_count = chunk[ bcnt ].value;
            ++bcnt;
            break;
        case SMBP_DataBlock:

            // create byte blocks
            int c;
            for( c = 0; c < byte_count; ++c )
                pResults->AddFrame( chunk[ bcnt + c ].ToDataByte() );

            bcnt += byte_count;

            byte_count = -1;

            break;
        }

        ++prot_elem_ndx;
    }

    int bytes_remaining = chunks.back().size() - bcnt;

    if( has_pec && bytes_remaining == 1 )
        pResults->AddFrame( chunks.back().back().ToPECFrame( CalcPEC( has_pec ) ) );
}